

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

pair<cmTarget_&,_bool> __thiscall
cmMakefile::CreateNewTarget(cmMakefile *this,string *name,TargetType type,PerConfig perConfig)

{
  pointer ppVar1;
  cmGlobalGenerator *this_00;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>,_bool>
  pVar2;
  pair<cmTarget_&,_bool> pVar3;
  bool local_e1;
  reference_wrapper<cmTarget> local_e0;
  cmStateSnapshot local_d8;
  cmStateDirectory local_c0;
  cmTarget *local_98 [3];
  bool local_79;
  reference_wrapper<cmTarget> local_78;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
  local_70;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
  it;
  cmTarget local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  local_40;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>,_bool>
  ib;
  PerConfig perConfig_local;
  TargetType type_local;
  string *name_local;
  cmMakefile *this_local;
  undefined1 local_10;
  
  ib._8_4_ = perConfig;
  ib._12_4_ = type;
  cmTarget::cmTarget(&local_48,name,type,VisibilityNormal,this,perConfig);
  pVar2 = std::
          unordered_map<std::__cxx11::string,cmTarget,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget>>>
          ::emplace<std::__cxx11::string_const&,cmTarget>
                    ((unordered_map<std::__cxx11::string,cmTarget,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget>>>
                      *)&this->Targets,name,&local_48);
  it = pVar2.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
       ._M_cur;
  ib.first.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  ._M_cur._0_1_ = pVar2.second;
  local_40 = it.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
             ._M_cur;
  cmTarget::~cmTarget(&local_48);
  local_70.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
               )local_40._M_cur;
  if (((byte)ib.first.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
             ._M_cur & 1) == 0) {
    ppVar1 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
             ::operator->(&local_70);
    local_78 = std::ref<cmTarget>(&ppVar1->second);
    local_79 = false;
    pVar3 = std::make_pair<std::reference_wrapper<cmTarget>,bool>(&local_78,&local_79);
    local_10 = pVar3.second;
  }
  else {
    ppVar1 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
             ::operator->(&local_70);
    local_98[0] = &ppVar1->second;
    std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::push_back(&this->OrderedTargets,local_98);
    this_00 = GetGlobalGenerator(this);
    ppVar1 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
             ::operator->(&local_70);
    cmGlobalGenerator::IndexTarget(this_00,&ppVar1->second);
    GetStateSnapshot(&local_d8,this);
    cmStateSnapshot::GetDirectory(&local_c0,&local_d8);
    cmStateDirectory::AddNormalTargetName(&local_c0,name);
    ppVar1 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
             ::operator->(&local_70);
    local_e0 = std::ref<cmTarget>(&ppVar1->second);
    local_e1 = true;
    pVar3 = std::make_pair<std::reference_wrapper<cmTarget>,bool>(&local_e0,&local_e1);
    local_10 = pVar3.second;
  }
  this_local = (cmMakefile *)pVar3.first;
  pVar3.second = (bool)local_10;
  pVar3.first = (cmTarget *)this_local;
  return pVar3;
}

Assistant:

std::pair<cmTarget&, bool> cmMakefile::CreateNewTarget(
  const std::string& name, cmStateEnums::TargetType type,
  cmTarget::PerConfig perConfig)
{
  auto ib = this->Targets.emplace(
    name, cmTarget(name, type, cmTarget::VisibilityNormal, this, perConfig));
  auto it = ib.first;
  if (!ib.second) {
    return std::make_pair(std::ref(it->second), false);
  }
  this->OrderedTargets.push_back(&it->second);
  this->GetGlobalGenerator()->IndexTarget(&it->second);
  this->GetStateSnapshot().GetDirectory().AddNormalTargetName(name);
  return std::make_pair(std::ref(it->second), true);
}